

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O1

netaddr * os_interface_generic_get_bindaddress(int af_type,netaddr_acl *filter,os_interface *os_if)

{
  uint8_t uVar1;
  netaddr *pnVar2;
  uint8_t uVar3;
  _Bool _Var4;
  netaddr *pnVar5;
  avl_tree *paVar6;
  avl_tree *paVar7;
  list_entity *plVar8;
  avl_node *paVar9;
  
  if ((((os_if == (os_interface *)0x0) || ((os_if->flags).any == true)) &&
      (filter->reject_count == 0)) && (0xfffffffffffffffd < filter->accept_count - 3)) {
    pnVar2 = filter->accept;
    uVar1 = pnVar2->_prefix_len;
    uVar3 = netaddr_get_af_maxprefix((uint)pnVar2->_type);
    if (uVar1 == uVar3) {
      if (filter->accept_count == 2) {
        pnVar5 = filter->accept;
        if ((pnVar2->_type == pnVar5[1]._type) ||
           (uVar1 = pnVar5[1]._prefix_len, uVar3 = netaddr_get_af_maxprefix((uint)pnVar5[1]._type),
           uVar1 != uVar3)) goto LAB_00125bcb;
        if ((uint)pnVar5[1]._type == af_type) {
          pnVar5 = pnVar5 + 1;
          goto LAB_00125bce;
        }
      }
      pnVar5 = (netaddr *)0x0;
      if ((uint)pnVar2->_type == af_type) {
        pnVar5 = pnVar2;
      }
      goto LAB_00125bce;
    }
  }
LAB_00125bcb:
  pnVar5 = (netaddr *)0x0;
LAB_00125bce:
  if (pnVar5 == (netaddr *)0x0) {
    pnVar5 = _get_exact_match_bindaddress(af_type,filter,os_if);
  }
  if (pnVar5 == (netaddr *)0x0) {
    if (os_if == (os_interface *)0x0) {
      paVar6 = os_interface_linux_get_tree();
      do {
        paVar6 = (avl_tree *)(paVar6->list_head).next;
        plVar8 = (paVar6->list_head).prev;
        paVar7 = os_interface_linux_get_tree();
        if (plVar8 == (paVar7->list_head).prev) goto LAB_00125c7b;
        for (paVar9 = paVar6[-3].root; (paVar9->list).prev != *(list_entity **)&paVar6[-3].count;
            paVar9 = (avl_node *)(paVar9->list).next) {
          if ((uint)*(byte *)((long)&paVar9[1].right + 2) == af_type) {
            pnVar5 = (netaddr *)((long)&paVar9[1].parent + 2);
            _Var4 = netaddr_acl_check_accept(filter,pnVar5);
            if (_Var4) goto LAB_00125c74;
          }
        }
        pnVar5 = (netaddr *)0x0;
LAB_00125c74:
      } while (pnVar5 == (netaddr *)0x0);
    }
    else {
      for (plVar8 = (os_if->addresses).list_head.next;
          plVar8->prev != (os_if->addresses).list_head.prev; plVar8 = plVar8->next) {
        if ((uint)*(byte *)((long)&plVar8[5].prev + 2) == af_type) {
          pnVar2 = (netaddr *)((long)&plVar8[4].prev + 2);
          _Var4 = netaddr_acl_check_accept(filter,pnVar2);
          if (_Var4) {
            return pnVar2;
          }
        }
      }
LAB_00125c7b:
      pnVar5 = (netaddr *)0x0;
    }
  }
  return pnVar5;
}

Assistant:

const struct netaddr *
os_interface_generic_get_bindaddress(int af_type, struct netaddr_acl *filter, struct os_interface *os_if) {
  const struct netaddr *result;

  result = NULL;
  if (os_if == NULL || os_if->flags.any) {
    result = _get_fixed_prefix(af_type, filter);
  }
  if (!result) {
    result = _get_exact_match_bindaddress(af_type, filter, os_if);
  }
  if (!result) {
    result = _get_matching_bindaddress(af_type, filter, os_if);
  }
  return result;
}